

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mathCoreSimplify.cpp
# Opt level: O1

void mathCore::xor_standardizer(expression *a)

{
  expSet *this;
  _Rb_tree_header *p_Var1;
  expression *a_00;
  bool bVar2;
  const_iterator cVar3;
  iterator iVar4;
  const_iterator __position;
  pair<std::_Rb_tree_node_base_*,_std::_Rb_tree_node_base_*> pVar5;
  expression *first;
  _Alloc_node __an;
  expSet tempStore;
  expression *peVar6;
  expression *peVar7;
  expression *local_78;
  _Alloc_node local_70;
  expression *local_68;
  _Rb_tree<expression_*,_expression_*,_std::_Identity<expression_*>,_compareUUID,_std::allocator<expression_*>_>
  local_60;
  
  bVar2 = is_xor(a);
  if (bVar2) {
    local_60._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_60._M_impl.super__Rb_tree_header._M_header;
    local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
    this = &a->contents;
    p_Var1 = &(a->contents)._M_t._M_impl.super__Rb_tree_header;
    local_68 = a;
    local_60._M_impl.super__Rb_tree_header._M_header._M_right =
         local_60._M_impl.super__Rb_tree_header._M_header._M_left;
    while (peVar6 = local_68,
          2 < (local_68->contents)._M_t._M_impl.super__Rb_tree_header._M_node_count) {
      std::
      _Rb_tree<expression_*,_expression_*,_std::_Identity<expression_*>,_compareUUID,_std::allocator<expression_*>_>
      ::clear(&local_60);
      cVar3._M_node = (peVar6->contents)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      __position._M_node = local_60._M_impl.super__Rb_tree_header._M_header._M_left;
      while ((_Rb_tree_header *)cVar3._M_node != p_Var1) {
        peVar6 = *(expression **)(cVar3._M_node + 1);
        cVar3._M_node =
             (_Base_ptr)
             std::
             _Rb_tree<expression*,expression*,std::_Identity<expression*>,compareUUID,std::allocator<expression*>>
             ::erase_abi_cxx11_((_Rb_tree<expression*,expression*,std::_Identity<expression*>,compareUUID,std::allocator<expression*>>
                                 *)this,cVar3);
        if ((_Rb_tree_header *)cVar3._M_node == p_Var1) {
          local_70._M_t = &local_60;
          std::
          _Rb_tree<expression*,expression*,std::_Identity<expression*>,compareUUID,std::allocator<expression*>>
          ::
          _M_insert_equal_<expression*const&,std::_Rb_tree<expression*,expression*,std::_Identity<expression*>,compareUUID,std::allocator<expression*>>::_Alloc_node>
                    ((_Rb_tree<expression*,expression*,std::_Identity<expression*>,compareUUID,std::allocator<expression*>>
                      *)local_70._M_t,__position,(expression **)&stack0xffffffffffffff78,&local_70);
        }
        else {
          peVar7 = *(expression **)(cVar3._M_node + 1);
          iVar4 = std::
                  _Rb_tree<expression*,expression*,std::_Identity<expression*>,compareUUID,std::allocator<expression*>>
                  ::erase_abi_cxx11_((_Rb_tree<expression*,expression*,std::_Identity<expression*>,compareUUID,std::allocator<expression*>>
                                      *)this,cVar3);
          copy((EVP_PKEY_CTX *)peVar6,(EVP_PKEY_CTX *)cVar3._M_node);
          copy((EVP_PKEY_CTX *)peVar7,(EVP_PKEY_CTX *)cVar3._M_node);
          negate(peVar6);
          negate(peVar7);
          binary_and(peVar6,(expression *)0x1081a3);
          binary_and(peVar6,(expression *)0x1081b1);
          local_78 = binary_or(peVar6,(expression *)0x1081bc);
          local_70._M_t = &local_60;
          __position._M_node =
               (_Base_ptr)
               std::
               _Rb_tree<expression*,expression*,std::_Identity<expression*>,compareUUID,std::allocator<expression*>>
               ::
               _M_insert_equal_<expression*,std::_Rb_tree<expression*,expression*,std::_Identity<expression*>,compareUUID,std::allocator<expression*>>::_Alloc_node>
                         ((_Rb_tree<expression*,expression*,std::_Identity<expression*>,compareUUID,std::allocator<expression*>>
                           *)local_70._M_t,__position,&local_78,&local_70);
          cVar3._M_node = iVar4._M_node;
        }
      }
      mergeMultiSet(this,(expSet *)&local_60);
    }
    cVar3._M_node = (local_68->contents)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    peVar7 = *(expression **)(cVar3._M_node + 1);
    iVar4 = std::
            _Rb_tree<expression*,expression*,std::_Identity<expression*>,compareUUID,std::allocator<expression*>>
            ::erase_abi_cxx11_((_Rb_tree<expression*,expression*,std::_Identity<expression*>,compareUUID,std::allocator<expression*>>
                                *)this,cVar3);
    a_00 = *(expression **)(iVar4._M_node + 1);
    std::
    _Rb_tree<expression*,expression*,std::_Identity<expression*>,compareUUID,std::allocator<expression*>>
    ::erase_abi_cxx11_((_Rb_tree<expression*,expression*,std::_Identity<expression*>,compareUUID,std::allocator<expression*>>
                        *)this,(const_iterator)iVar4._M_node);
    copy((EVP_PKEY_CTX *)peVar7,(EVP_PKEY_CTX *)iVar4._M_node);
    copy((EVP_PKEY_CTX *)a_00,(EVP_PKEY_CTX *)iVar4._M_node);
    negate(peVar7);
    negate(a_00);
    local_78 = binary_and(peVar7,(expression *)0x10827b);
    pVar5 = std::
            _Rb_tree<expression_*,_expression_*,_std::_Identity<expression_*>,_compareUUID,_std::allocator<expression_*>_>
            ::_M_get_insert_equal_pos(&this->_M_t,&local_78);
    local_70._M_t = &this->_M_t;
    std::
    _Rb_tree<expression*,expression*,std::_Identity<expression*>,compareUUID,std::allocator<expression*>>
    ::
    _M_insert_<expression*,std::_Rb_tree<expression*,expression*,std::_Identity<expression*>,compareUUID,std::allocator<expression*>>::_Alloc_node>
              ((_Rb_tree<expression*,expression*,std::_Identity<expression*>,compareUUID,std::allocator<expression*>>
                *)this,pVar5.first,pVar5.second,&local_78,&local_70);
    local_78 = binary_and(peVar7,(expression *)0x1082b2);
    pVar5 = std::
            _Rb_tree<expression_*,_expression_*,_std::_Identity<expression_*>,_compareUUID,_std::allocator<expression_*>_>
            ::_M_get_insert_equal_pos(&this->_M_t,&local_78);
    local_70._M_t = &this->_M_t;
    std::
    _Rb_tree<expression*,expression*,std::_Identity<expression*>,compareUUID,std::allocator<expression*>>
    ::
    _M_insert_<expression*,std::_Rb_tree<expression*,expression*,std::_Identity<expression*>,compareUUID,std::allocator<expression*>>::_Alloc_node>
              ((_Rb_tree<expression*,expression*,std::_Identity<expression*>,compareUUID,std::allocator<expression*>>
                *)this,pVar5.first,pVar5.second,&local_78,&local_70);
    trans_or(peVar6);
    std::
    _Rb_tree<expression_*,_expression_*,_std::_Identity<expression_*>,_compareUUID,_std::allocator<expression_*>_>
    ::~_Rb_tree(&local_60);
  }
  return;
}

Assistant:

void mathCore::xor_standardizer(expression* a) {
	if (mathCore::is_xor(a)) {
		// Just by the number of variables you can grasp how much more complicated this is!
		expSet tempStore;
		expSet::iterator iter, hintOther;
		expression *first, *second, *firstNew, *secondNew;

		// Keep going until there are at most two things in the tree!
		while (a->contents.size() > 2) {
			// Clear the tempStore, Start at the beginning!
			tempStore.clear();
			iter = a->contents.begin();
			hintOther = tempStore.begin();	// Hints to make this crazy slow thing faster!

											// This runs until we are at the end of the expression!
			while (iter != a->contents.end()) {

				first = *iter;
				iter = a->contents.erase(iter); // Remove it from contents, go forward!
				if (iter == a->contents.end()) { // If we have no other pair just insert first into the tempStore and continue!
					tempStore.insert(hintOther, first);
				}
				else {
					second = *iter;		// Pair of first!
					iter = a->contents.erase(iter);	// Keep moving forward!

													// Construct ~a*b + ~b*a !
					firstNew = mathCore::copy(first);
					secondNew = mathCore::copy(second);
					mathCore::negate(first);
					mathCore::negate(second);

					// Hints keep this faster!
					hintOther = tempStore.insert(hintOther,
						// AND OR of AND's!
						mathCore::binary_or(binary_and(first, secondNew), binary_and(firstNew, second)));
				}

			}
			// Now Merge tempStore into a, and continue all over again!
			mergeMultiSet(a->contents, tempStore);
		}

		// Now the XOR has exactly 2 elements!
		iter = a->contents.begin();
		first = *iter;
		iter = a->contents.erase(iter);
		second = *iter;
		iter = a->contents.erase(iter);
		// Remove them and construct the new things which go into the XOR!

		firstNew = mathCore::copy(first);
		secondNew = mathCore::copy(second);
		mathCore::negate(first);
		mathCore::negate(second);

		// Finally insert these last two into the XOR!
		a->contents.insert(binary_and(first, secondNew));
		a->contents.insert(binary_and(firstNew, second));

		// Now we are an OR expression!
		mathCore::trans_or(a);
	}
}